

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O1

void __thiscall
helics::ValueFederate::registerValueInterfacesToml(ValueFederate *this,string *tomlString)

{
  pointer pbVar1;
  string_view units_00;
  string_view units_01;
  string_view units_02;
  string_view units_03;
  string_view units_04;
  undefined8 uVar2;
  bool bVar3;
  value_type *pvVar4;
  array_type *paVar5;
  anon_class_8_1_66e135f8 callback;
  enable_if_t<detail::is_exact_toml_type<bool,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<bool>_&>
  pbVar6;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *v;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  pbVar7;
  enable_if_t<detail::is_exact_toml_type<double,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<double>_&>
  pdVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *v_00;
  string_type *psVar9;
  anon_class_8_1_ba1d534b aVar10;
  HelicsException *pHVar11;
  value *extraout_RDX;
  value *element;
  value *element_00;
  value *element_01;
  value *extraout_RDX_00;
  value *extraout_RDX_01;
  value *extraout_RDX_02;
  value *extraout_RDX_03;
  value *pvVar12;
  value *extraout_RDX_04;
  value *element_02;
  value *element_03;
  value *element_04;
  value *extraout_RDX_05;
  value *extraout_RDX_06;
  value *extraout_RDX_07;
  value *extraout_RDX_08;
  value *extraout_RDX_09;
  value *extraout_RDX_10;
  value *element_05;
  value *element_06;
  value *element_07;
  value *extraout_RDX_11;
  value *extraout_RDX_12;
  value *extraout_RDX_13;
  value *extraout_RDX_14;
  value *extraout_RDX_15;
  pointer pbVar13;
  basic_value<toml::type_config> *v_01;
  key_type *key;
  basic_value<toml::type_config> *target;
  pointer pbVar14;
  double dVar15;
  string_view key_00;
  string_view key_01;
  string_view name_00;
  string_view info_00;
  string_view newTarget;
  string_view newTarget_00;
  string_view newTarget_01;
  string_view key_02;
  string_view target_00;
  string_view key_03;
  string_view key_04;
  string_view name_01;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view type_00;
  string_view type_01;
  string_view type_02;
  string_view type_03;
  string_view type_04;
  string units_1;
  bool defaultGlobal;
  string type;
  string info;
  string units;
  string name;
  value doc;
  undefined1 local_458 [16];
  undefined1 local_448 [31];
  bool local_429;
  undefined1 local_428 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  _Alloc_hider local_400;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [56];
  region local_3b0;
  undefined1 local_348 [32];
  undefined1 local_328 [32];
  undefined1 local_308 [16];
  undefined1 local_2f8 [56];
  region local_2c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  pointer local_178;
  double local_170;
  string local_168;
  string local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  Publication *pPStack_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  char *pcStack_110;
  Publication *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_100;
  basic_value<toml::type_config> local_f8;
  
  local_408._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  toml::basic_value<toml::type_config>::basic_value(&local_f8);
  fileops::loadToml((value *)local_3f8,tomlString);
  v_01 = (basic_value<toml::type_config> *)local_3f8;
  toml::basic_value<toml::type_config>::operator=(&local_f8,v_01);
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_3f8,(EVP_PKEY_CTX *)v_01);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_348);
  toml::detail::region::~region(&local_3b0);
  local_429 = false;
  local_3f8._0_8_ = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"defaultglobal","");
  fileops::replaceIfMember<bool>(&local_f8,(string *)local_3f8,&local_429);
  if ((undefined1 *)local_3f8._0_8_ != local_3e8) {
    operator_delete((void *)local_3f8._0_8_,(ulong)(local_3e8._0_8_ + 1));
  }
  local_3f8._0_8_ = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"publications","");
  bVar3 = fileops::isMember(&local_f8,(string *)local_3f8);
  if ((undefined1 *)local_3f8._0_8_ != local_3e8) {
    operator_delete((void *)local_3f8._0_8_,(ulong)(local_3e8._0_8_ + 1));
  }
  if (bVar3) {
    local_3f8._0_8_ = local_3e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"publications","");
    pvVar4 = toml::basic_value<toml::type_config>::at(&local_f8,(key_type *)local_3f8);
    if ((undefined1 *)local_3f8._0_8_ != local_3e8) {
      operator_delete((void *)local_3f8._0_8_,(ulong)(local_3e8._0_8_ + 1));
    }
    if (pvVar4->type_ != array) {
      pHVar11 = (HelicsException *)__cxa_allocate_exception(0x28);
      message._M_str = "publications section in toml file must be an array";
      message._M_len = 0x32;
      HelicsException::HelicsException(pHVar11,message);
      *(undefined ***)pHVar11 = &PTR__HelicsException_004cb740;
      __cxa_throw(pHVar11,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    paVar5 = toml::basic_value<toml::type_config>::as_array(pvVar4);
    pbVar13 = (paVar5->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_178 = (paVar5->
                super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar13 != local_178) {
      local_220 = &vStack_258;
      local_400._M_p = local_348;
      pvVar12 = extraout_RDX;
      do {
        fileops::getName_abi_cxx11_(&local_218,(fileops *)pbVar13,pvVar12);
        key_00._M_str = local_218._M_dataplus._M_p;
        key_00._M_len = local_218._M_string_length;
        callback.pubObj =
             ValueFederateManager::getPublication
                       ((ValueFederateManager *)
                        (((anon_union_64_11_c2653db1_for_basic_value<toml::type_config>_2 *)
                         &(local_408._M_pi)->_M_use_count)->integer_).value,key_00);
        if (((callback.pubObj)->super_Interface).handle.hid == -1700000000) {
          local_308._0_8_ = local_2f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"type","");
          bVar3 = toml::basic_value<toml::type_config>::contains(pbVar13,(key_type *)local_308);
          if (bVar3) {
            pvVar4 = toml::basic_value<toml::type_config>::at(pbVar13,(key_type *)local_308);
            fileops::tomlAsString_abi_cxx11_((string *)local_3f8,(fileops *)pvVar4,element);
          }
          else {
            local_3f8._0_8_ = local_3e8;
            local_3f8._8_8_ = 0;
            local_3e8._0_8_ = local_3e8._0_8_ & 0xffffffffffffff00;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8) {
            operator_delete((void *)local_308._0_8_,local_2f8._0_8_ + 1);
          }
          local_458._0_8_ = local_448;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"unit","");
          bVar3 = toml::basic_value<toml::type_config>::contains(pbVar13,(key_type *)local_458);
          if (bVar3) {
            pvVar4 = toml::basic_value<toml::type_config>::at(pbVar13,(key_type *)local_458);
            fileops::tomlAsString_abi_cxx11_((string *)local_308,(fileops *)pvVar4,element_00);
          }
          else {
            local_308._0_8_ = local_2f8;
            local_308._8_8_ = (Publication *)0x0;
            local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
          }
          if ((undefined1 *)local_458._0_8_ != local_448) {
            operator_delete((void *)local_458._0_8_,(ulong)(local_448._0_8_ + 1));
          }
          local_458._0_8_ = local_448;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"units","");
          fileops::replaceIfMember(pbVar13,(string *)local_458,(string *)local_308);
          if ((undefined1 *)local_458._0_8_ != local_448) {
            operator_delete((void *)local_458._0_8_,(ulong)(local_448._0_8_ + 1));
          }
          local_458._0_8_ = local_448;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"global","");
          local_428[0] = local_429;
          pbVar6 = toml::find_or<bool,toml::type_config,std::__cxx11::string>
                             (pbVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_458,(bool *)local_428);
          bVar3 = *pbVar6;
          if ((Publication *)local_458._0_8_ != (Publication *)local_448) {
            operator_delete((void *)local_458._0_8_,(ulong)(local_448._0_8_ + 1));
          }
          if (bVar3 == false) {
            local_108 = (Publication *)local_308._8_8_;
            paStack_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_308._0_8_;
            units_01._M_str = (char *)local_308._0_8_;
            units_01._M_len = local_308._8_8_;
            name_00._M_str = local_218._M_dataplus._M_p;
            name_00._M_len = local_218._M_string_length;
            type_01._M_str = (char *)local_3f8._0_8_;
            type_01._M_len = local_3f8._8_8_;
            callback.pubObj =
                 registerPublication((ValueFederate *)local_408._M_pi,name_00,type_01,units_01);
          }
          else {
            local_458._0_8_ = local_308._8_8_;
            local_458._8_8_ = local_308._0_8_;
            units_00._M_str = (char *)local_308._0_8_;
            units_00._M_len = local_308._8_8_;
            key_01._M_str = local_218._M_dataplus._M_p;
            key_01._M_len = local_218._M_string_length;
            type_00._M_str = (char *)local_3f8._0_8_;
            type_00._M_len = local_3f8._8_8_;
            callback.pubObj =
                 ValueFederateManager::registerPublication
                           (*(ValueFederateManager **)&(local_408._M_pi)->_M_use_count,key_01,
                            type_00,units_00);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8) {
            operator_delete((void *)local_308._0_8_,local_2f8._0_8_ + 1);
          }
          if ((undefined1 *)local_3f8._0_8_ != local_3e8) {
            operator_delete((void *)local_3f8._0_8_,(ulong)(local_3e8._0_8_ + 1));
          }
        }
        local_428._0_8_ = &local_418;
        local_418._M_local_buf[4] = 's';
        local_418._0_4_ = 0x67616c66;
        local_428._8_8_ = (Publication *)0x5;
        local_418._M_local_buf[5] = '\0';
        local_328._8_8_ = local_408._M_pi;
        local_328._0_8_ = callback.pubObj;
        toml::basic_value<toml::type_config>::basic_value
                  ((basic_value<toml::type_config> *)local_3f8);
        v = toml::find_or<toml::type_config,std::__cxx11::string>
                      (pbVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_428,(basic_value<toml::type_config> *)local_3f8);
        toml::basic_value<toml::type_config>::basic_value
                  ((basic_value<toml::type_config> *)local_308,v);
        if (local_308[0] != empty) {
          if (local_308[0] == array) {
            paVar5 = toml::basic_value<toml::type_config>::as_array
                               ((basic_value<toml::type_config> *)local_308);
            pbVar1 = (paVar5->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar14 = (paVar5->
                           super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                           )._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar1;
                pbVar14 = pbVar14 + 1) {
              v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                   *)toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar14);
              loadOptions<toml::basic_value<toml::type_config>,_helics::Publication>::
              anon_class_16_2_5e8ce78e::operator()
                        ((anon_class_16_2_5e8ce78e *)local_328,(string *)v);
            }
          }
          else {
            v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                 *)toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                             ((basic_value<toml::type_config> *)local_308);
            loadOptions<toml::basic_value<toml::type_config>,_helics::Publication>::
            anon_class_16_2_5e8ce78e::operator()((anon_class_16_2_5e8ce78e *)local_328,(string *)v);
          }
        }
        if (((char *)(local_428._0_8_ - 1))[local_428._8_8_] == 's') {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428);
          local_458._0_8_ = local_448;
          local_458._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_448._0_8_ = local_448._0_8_ & 0xffffffffffffff00;
          v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
              toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                        (pbVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_428,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_458);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)v);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                 *)local_458;
            loadOptions<toml::basic_value<toml::type_config>,_helics::Publication>::
            anon_class_16_2_5e8ce78e::operator()((anon_class_16_2_5e8ce78e *)local_328,(string *)v);
          }
          if ((Publication *)local_458._0_8_ != (Publication *)local_448) {
            v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                 *)(local_448._0_8_ + 1);
            operator_delete((void *)local_458._0_8_,(ulong)v);
          }
        }
        toml::basic_value<toml::type_config>::cleanup
                  ((basic_value<toml::type_config> *)local_308,(EVP_PKEY_CTX *)v);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_220);
        toml::detail::region::~region(&local_2c0);
        toml::basic_value<toml::type_config>::cleanup
                  ((basic_value<toml::type_config> *)local_3f8,(EVP_PKEY_CTX *)v);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_400._M_p);
        toml::detail::region::~region(&local_3b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._0_8_ != &local_418) {
          operator_delete((void *)local_428._0_8_,
                          CONCAT26(local_418._6_2_,
                                   CONCAT15(local_418._M_local_buf[5],
                                            CONCAT14(local_418._M_local_buf[4],local_418._0_4_))) +
                          1);
        }
        local_3f8._0_8_ = (pointer)0x0;
        local_3f8._8_8_ = 0;
        local_3e8._8_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:226:9)>
             ::_M_invoke;
        local_3e8._0_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:226:9)>
             ::_M_manager;
        local_308._0_8_ = 0;
        local_308._8_8_ = 0;
        local_2f8._8_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:227:9)>
             ::_M_invoke;
        local_2f8._0_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:227:9)>
             ::_M_manager;
        local_458._8_8_ = 0;
        local_448._8_8_ =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:228:9)>
             ::_M_invoke;
        local_448._0_8_ =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:228:9)>
             ::_M_manager;
        local_458._0_8_ = callback.pubObj;
        processOptions(pbVar13,(function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                *)local_3f8,
                       (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)local_308,(function<void_(int,_int)> *)local_458);
        if ((code *)local_448._0_8_ != (code *)0x0) {
          (*(code *)local_448._0_8_)(local_458,local_458,3);
        }
        if ((code *)local_2f8._0_8_ != (code *)0x0) {
          (*(code *)local_2f8._0_8_)
                    ((basic_value<toml::type_config> *)local_308,
                     (basic_value<toml::type_config> *)local_308,3);
        }
        if ((code *)local_3e8._0_8_ != (code *)0x0) {
          (*(code *)local_3e8._0_8_)
                    ((basic_value<toml::type_config> *)local_3f8,
                     (basic_value<toml::type_config> *)local_3f8,3);
        }
        local_308._0_8_ = local_2f8;
        local_308._8_8_ = (Publication *)0x5;
        local_2f8._0_6_ = 0x7361696c61;
        local_458._8_8_ = local_408._M_pi;
        local_448._8_8_ =
             std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:230:42)>
             ::_M_invoke;
        local_448._0_8_ =
             std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:230:42)>
             ::_M_manager;
        local_3f8._0_8_ = local_3e8;
        local_3f8._8_8_ = 0;
        local_3e8._0_8_ = local_3e8._0_8_ & 0xffffffffffffff00;
        local_458._0_8_ = callback.pubObj;
        pbVar7 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                           (pbVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_308,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_3f8);
        if (pbVar7->_M_string_length != 0) {
          if ((code *)local_448._0_8_ == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*(code *)local_448._8_8_)(local_458,pbVar7);
        }
        if ((undefined1 *)local_3f8._0_8_ != local_3e8) {
          operator_delete((void *)local_3f8._0_8_,local_3e8._0_8_ + 1);
        }
        if ((code *)local_448._0_8_ != (code *)0x0) {
          (*(code *)local_448._0_8_)(local_458,local_458,3);
        }
        if ((undefined1 *)local_308._0_8_ != local_2f8) {
          operator_delete((void *)local_308._0_8_,local_2f8._0_8_ + 1);
        }
        local_3e8._0_8_ = 0x636e6172656c6f74;
        local_3f8._8_8_ = 9;
        local_3e8._8_2_ = 0x65;
        local_308._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xbff0000000000000;
        local_3f8._0_8_ = local_3e8;
        pdVar8 = toml::find_or<double,toml::type_config,std::__cxx11::string>
                           (pbVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_3f8,(double *)local_308);
        dVar15 = *pdVar8;
        if ((undefined1 *)local_3f8._0_8_ != local_3e8) {
          local_170 = *pdVar8;
          operator_delete((void *)local_3f8._0_8_,local_3e8._0_8_ + 1);
          dVar15 = local_170;
        }
        if (0.0 < dVar15) {
          if ((callback.pubObj)->delta <= 0.0 && (callback.pubObj)->delta != 0.0) {
            (callback.pubObj)->changeDetectionEnabled = true;
          }
          (callback.pubObj)->delta = dVar15;
        }
        local_3f8._0_8_ = local_3e8;
        local_3f8._8_8_ = 4;
        local_3e8._0_5_ = 0x6f666e69;
        bVar3 = toml::basic_value<toml::type_config>::contains(pbVar13,(key_type *)local_3f8);
        if (bVar3) {
          pvVar4 = toml::basic_value<toml::type_config>::at(pbVar13,(key_type *)local_3f8);
          fileops::tomlAsString_abi_cxx11_((string *)local_328,(fileops *)pvVar4,element_01);
        }
        else {
          local_328._0_8_ = local_328 + 0x10;
          local_328._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_328[0x10] = '\0';
        }
        if ((undefined1 *)local_3f8._0_8_ != local_3e8) {
          operator_delete((void *)local_3f8._0_8_,local_3e8._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          info_00._M_str = (char *)local_328._0_8_;
          info_00._M_len = local_328._8_8_;
          Interface::setInfo(&(callback.pubObj)->super_Interface,info_00);
        }
        local_3f8._8_8_ = 0;
        local_3e8._8_8_ =
             std::
             _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:242:20)>
             ::_M_invoke;
        local_3e8._0_8_ =
             std::
             _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:242:20)>
             ::_M_manager;
        local_3f8._0_8_ = callback.pubObj;
        loadTags(pbVar13,(function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)local_3f8);
        if ((code *)local_3e8._0_8_ != (code *)0x0) {
          (*(code *)local_3e8._0_8_)
                    ((basic_value<toml::type_config> *)local_3f8,
                     (basic_value<toml::type_config> *)local_3f8,3);
        }
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        local_240.field_2._M_allocated_capacity._0_4_ = 0x67726174;
        local_240._M_string_length = 7;
        local_240.field_2._M_allocated_capacity._4_4_ = 0x737465;
        toml::basic_value<toml::type_config>::basic_value
                  ((basic_value<toml::type_config> *)local_3f8);
        v_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)toml::find_or<toml::type_config,std::__cxx11::string>
                            (pbVar13,&local_240,(basic_value<toml::type_config> *)local_3f8);
        toml::basic_value<toml::type_config>::basic_value
                  ((basic_value<toml::type_config> *)local_308,
                   (basic_value<toml::type_config> *)v_00);
        if (local_308[0] != empty) {
          if (local_308[0] == array) {
            paVar5 = toml::basic_value<toml::type_config>::as_array
                               ((basic_value<toml::type_config> *)local_308);
            pbVar1 = (paVar5->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar14 = (paVar5->
                           super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                           )._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar1;
                pbVar14 = pbVar14 + 1) {
              psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar14);
              v_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)psVar9->_M_string_length;
              newTarget._M_str = (psVar9->_M_dataplus)._M_p;
              newTarget._M_len = (size_t)v_00;
              Interface::addDestinationTarget(&(callback.pubObj)->super_Interface,newTarget,UNKNOWN)
              ;
            }
          }
          else {
            psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                               ((basic_value<toml::type_config> *)local_308);
            v_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)psVar9->_M_string_length;
            newTarget_00._M_str = (psVar9->_M_dataplus)._M_p;
            newTarget_00._M_len = (size_t)v_00;
            Interface::addDestinationTarget
                      (&(callback.pubObj)->super_Interface,newTarget_00,UNKNOWN);
          }
        }
        if (local_240._M_dataplus._M_p[local_240._M_string_length - 1] == 's') {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_240);
          local_458._0_8_ = local_448;
          local_458._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_448._0_8_ = local_448._0_8_ & 0xffffffffffffff00;
          pbVar7 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                             (pbVar13,&local_240,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_458);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar7);
          v_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_458._8_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            newTarget_01._M_str = (char *)local_458._0_8_;
            newTarget_01._M_len = local_458._8_8_;
            Interface::addDestinationTarget
                      (&(callback.pubObj)->super_Interface,newTarget_01,UNKNOWN);
          }
          if ((Publication *)local_458._0_8_ != (Publication *)local_448) {
            v_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_448._0_8_ + 1);
            operator_delete((void *)local_458._0_8_,(ulong)v_00);
          }
        }
        toml::basic_value<toml::type_config>::cleanup
                  ((basic_value<toml::type_config> *)local_308,(EVP_PKEY_CTX *)v_00->_M_local_buf);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_220);
        toml::detail::region::~region(&local_2c0);
        toml::basic_value<toml::type_config>::cleanup
                  ((basic_value<toml::type_config> *)local_3f8,(EVP_PKEY_CTX *)v_00->_M_local_buf);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_400._M_p);
        toml::detail::region::~region(&local_3b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,
                          CONCAT44(local_240.field_2._M_allocated_capacity._4_4_,
                                   local_240.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((Publication *)local_328._0_8_ != (Publication *)(local_328 + 0x10)) {
          operator_delete((void *)local_328._0_8_,CONCAT71(local_328._17_7_,local_328[0x10]) + 1);
        }
        local_3f8._0_8_ = local_3e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"destination","");
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"inputs","");
        addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__0>
                  (pbVar13,(string *)local_3f8,&local_198,callback);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_3f8._0_8_ != local_3e8) {
          operator_delete((void *)local_3f8._0_8_,(ulong)(local_3e8._0_8_ + 1));
        }
        local_3f8._0_8_ = local_3e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"destination","");
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"targets","");
        addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__0>
                  (pbVar13,(string *)local_3f8,&local_1b8,callback);
        pvVar12 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          pvVar12 = extraout_RDX_01;
        }
        if ((undefined1 *)local_3f8._0_8_ != local_3e8) {
          operator_delete((void *)local_3f8._0_8_,(ulong)(local_3e8._0_8_ + 1));
          pvVar12 = extraout_RDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          pvVar12 = extraout_RDX_03;
        }
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 != local_178);
    }
  }
  local_3f8._0_8_ = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"subscriptions","");
  bVar3 = fileops::isMember(&local_f8,(string *)local_3f8);
  if ((undefined1 *)local_3f8._0_8_ != local_3e8) {
    operator_delete((void *)local_3f8._0_8_,(ulong)(local_3e8._0_8_ + 1));
  }
  if (bVar3) {
    local_3f8._0_8_ = local_3e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"subscriptions","");
    pvVar4 = toml::basic_value<toml::type_config>::at(&local_f8,(key_type *)local_3f8);
    if ((undefined1 *)local_3f8._0_8_ != local_3e8) {
      operator_delete((void *)local_3f8._0_8_,(ulong)(local_3e8._0_8_ + 1));
    }
    if (pvVar4->type_ != array) {
      pHVar11 = (HelicsException *)__cxa_allocate_exception(0x28);
      message_00._M_str = "subscriptions section in toml file must be an array";
      message_00._M_len = 0x33;
      HelicsException::HelicsException(pHVar11,message_00);
      *(undefined ***)pHVar11 = &PTR__HelicsException_004cb740;
      __cxa_throw(pHVar11,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    paVar5 = toml::basic_value<toml::type_config>::as_array(pvVar4);
    pbVar13 = (paVar5->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_400._M_p =
         (pointer)(paVar5->
                  super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar13 != (pointer)local_400._M_p) {
      pvVar12 = extraout_RDX_04;
      do {
        fileops::getName_abi_cxx11_((string *)local_3f8,(fileops *)pbVar13,pvVar12);
        uVar2 = local_3f8._8_8_;
        if (local_3f8._8_8_ == 0) {
          local_308._0_8_ = local_2f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"target","");
          fileops::replaceIfMember(pbVar13,(string *)local_308,(string *)local_3f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8) {
            operator_delete((void *)local_308._0_8_,local_2f8._0_8_ + 1);
          }
        }
        key_02._M_str = (char *)local_3f8._0_8_;
        key_02._M_len = local_3f8._8_8_;
        aVar10.inp = ValueFederateManager::getInputByTarget
                               ((ValueFederateManager *)
                                (((anon_union_64_11_c2653db1_for_basic_value<toml::type_config>_2 *)
                                 &(local_408._M_pi)->_M_use_count)->integer_).value,key_02);
        if (((aVar10.inp)->super_Interface).handle.hid == -1700000000) {
          local_458._0_8_ = local_448;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"type","");
          bVar3 = toml::basic_value<toml::type_config>::contains(pbVar13,(string *)local_458);
          if (bVar3) {
            pvVar4 = toml::basic_value<toml::type_config>::at(pbVar13,(string *)local_458);
            fileops::tomlAsString_abi_cxx11_((string *)local_308,(fileops *)pvVar4,element_02);
          }
          else {
            local_308._0_8_ = local_2f8;
            local_308._8_8_ = (Publication *)0x0;
            local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
          }
          if ((undefined1 *)local_458._0_8_ != local_448) {
            operator_delete((void *)local_458._0_8_,(ulong)(local_448._0_8_ + 1));
          }
          local_428._0_8_ = &local_418;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"unit","");
          bVar3 = toml::basic_value<toml::type_config>::contains(pbVar13,(key_type *)local_428);
          if (bVar3) {
            pvVar4 = toml::basic_value<toml::type_config>::at(pbVar13,(key_type *)local_428);
            fileops::tomlAsString_abi_cxx11_((string *)local_458,(fileops *)pvVar4,element_03);
          }
          else {
            local_458._0_8_ = local_448;
            local_458._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_448._0_8_ = local_448._0_8_ & 0xffffffffffffff00;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._0_8_ != &local_418) {
            operator_delete((void *)local_428._0_8_,
                            CONCAT26(local_418._6_2_,
                                     CONCAT15(local_418._M_local_buf[5],
                                              CONCAT14(local_418._M_local_buf[4],local_418._0_4_)))
                            + 1);
          }
          local_428._0_8_ = &local_418;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"units","");
          fileops::replaceIfMember(pbVar13,(key_type *)local_428,(string *)local_458);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._0_8_ != &local_418) {
            operator_delete((void *)local_428._0_8_,
                            CONCAT26(local_418._6_2_,
                                     CONCAT15(local_418._M_local_buf[5],
                                              CONCAT14(local_418._M_local_buf[4],local_418._0_4_)))
                            + 1);
          }
          local_118 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_458._8_8_;
          pcStack_110 = (char *)local_458._0_8_;
          units_02._M_str = (char *)local_458._0_8_;
          units_02._M_len = local_458._8_8_;
          type_02._M_str = (char *)local_308._0_8_;
          type_02._M_len = local_308._8_8_;
          aVar10.inp = registerInput((ValueFederate *)local_408._M_pi,(string_view)ZEXT816(0),
                                     type_02,units_02);
          if (uVar2 != 0) {
            target_00._M_str = (char *)local_3f8._0_8_;
            target_00._M_len = local_3f8._8_8_;
            Input::addPublication(aVar10.inp,target_00);
          }
          if ((undefined1 *)local_458._0_8_ != local_448) {
            operator_delete((void *)local_458._0_8_,(ulong)(local_448._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8) {
            operator_delete((void *)local_308._0_8_,local_2f8._0_8_ + 1);
          }
        }
        local_458._0_8_ = (Publication *)local_448;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"default","");
        bVar3 = toml::basic_value<toml::type_config>::contains(pbVar13,(key_type *)local_458);
        if (bVar3) {
          pvVar4 = toml::basic_value<toml::type_config>::at(pbVar13,(key_type *)local_458);
          fileops::tomlAsString_abi_cxx11_((string *)local_308,(fileops *)pvVar4,element_04);
        }
        else {
          local_308._0_8_ = local_2f8;
          local_308._8_8_ = (Publication *)0x0;
          local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
        }
        if ((Publication *)local_458._0_8_ != (Publication *)local_448) {
          operator_delete((void *)local_458._0_8_,(ulong)(local_448._0_8_ + 1));
        }
        if ((Publication *)local_308._8_8_ != (Publication *)0x0) {
          std::
          variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
          ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       *)&(aVar10.inp)->lastValue,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308
                     );
        }
        loadOptions<toml::basic_value<toml::type_config>,helics::Input>
                  ((ValueFederate *)local_408._M_pi,pbVar13,aVar10.inp);
        local_458._0_8_ = (Publication *)local_448;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"source","");
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"publications","");
        addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__1>
                  (pbVar13,(string *)local_458,&local_148,aVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if ((Publication *)local_458._0_8_ != (Publication *)local_448) {
          operator_delete((void *)local_458._0_8_,(ulong)(local_448._0_8_ + 1));
        }
        local_458._0_8_ = (Publication *)local_448;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"source","");
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"targets","");
        addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__1>
                  (pbVar13,(string *)local_458,&local_168,aVar10);
        pvVar12 = extraout_RDX_05;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          pvVar12 = extraout_RDX_06;
        }
        if ((Publication *)local_458._0_8_ != (Publication *)local_448) {
          operator_delete((void *)local_458._0_8_,(ulong)(local_448._0_8_ + 1));
          pvVar12 = extraout_RDX_07;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8) {
          operator_delete((void *)local_308._0_8_,local_2f8._0_8_ + 1);
          pvVar12 = extraout_RDX_08;
        }
        if ((undefined1 *)local_3f8._0_8_ != local_3e8) {
          operator_delete((void *)local_3f8._0_8_,(ulong)(local_3e8._0_8_ + 1));
          pvVar12 = extraout_RDX_09;
        }
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 != (pointer)local_400._M_p);
    }
  }
  local_3f8._0_8_ = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"inputs","");
  key = (key_type *)local_3f8;
  bVar3 = fileops::isMember(&local_f8,key);
  if ((undefined1 *)local_3f8._0_8_ != local_3e8) {
    key = (key_type *)(local_3e8._0_8_ + 1);
    operator_delete((void *)local_3f8._0_8_,(ulong)key);
  }
  if (bVar3) {
    local_3f8._0_8_ = local_3e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"inputs","");
    key = (key_type *)local_3f8;
    pvVar4 = toml::basic_value<toml::type_config>::at(&local_f8,key);
    if ((undefined1 *)local_3f8._0_8_ != local_3e8) {
      key = (key_type *)(local_3e8._0_8_ + 1);
      operator_delete((void *)local_3f8._0_8_,(ulong)key);
    }
    if (pvVar4->type_ != array) {
      pHVar11 = (HelicsException *)__cxa_allocate_exception(0x28);
      message_01._M_str = "inputs section in toml file must be an array";
      message_01._M_len = 0x2c;
      HelicsException::HelicsException(pHVar11,message_01);
      *(undefined ***)pHVar11 = &PTR__HelicsException_004cb740;
      __cxa_throw(pHVar11,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    paVar5 = toml::basic_value<toml::type_config>::as_array(pvVar4);
    pbVar13 = (paVar5->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_400._M_p =
         (pointer)(paVar5->
                  super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar13 != (pointer)local_400._M_p) {
      pvVar12 = extraout_RDX_10;
      do {
        fileops::getName_abi_cxx11_((string *)local_3f8,(fileops *)pbVar13,pvVar12);
        key_03._M_str = (char *)local_3f8._0_8_;
        key_03._M_len = local_3f8._8_8_;
        aVar10.inp = ValueFederateManager::getInput
                               ((ValueFederateManager *)
                                (((anon_union_64_11_c2653db1_for_basic_value<toml::type_config>_2 *)
                                 &(local_408._M_pi)->_M_use_count)->integer_).value,key_03);
        if (((aVar10.inp)->super_Interface).handle.hid == -1700000000) {
          local_458._0_8_ = (Publication *)local_448;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"type","");
          bVar3 = toml::basic_value<toml::type_config>::contains(pbVar13,(string *)local_458);
          if (bVar3) {
            pvVar4 = toml::basic_value<toml::type_config>::at(pbVar13,(string *)local_458);
            fileops::tomlAsString_abi_cxx11_((string *)local_308,(fileops *)pvVar4,element_05);
          }
          else {
            local_308._0_8_ = local_2f8;
            local_308._8_8_ = (Publication *)0x0;
            local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
          }
          if ((Publication *)local_458._0_8_ != (Publication *)local_448) {
            operator_delete((void *)local_458._0_8_,(ulong)(local_448._0_8_ + 1));
          }
          local_428._0_8_ = &local_418;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"unit","");
          bVar3 = toml::basic_value<toml::type_config>::contains(pbVar13,(key_type *)local_428);
          if (bVar3) {
            pvVar4 = toml::basic_value<toml::type_config>::at(pbVar13,(key_type *)local_428);
            fileops::tomlAsString_abi_cxx11_((string *)local_458,(fileops *)pvVar4,element_06);
          }
          else {
            local_458._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_448._0_8_ = local_448._0_8_ & 0xffffffffffffff00;
            local_458._0_8_ = (Publication *)local_448;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._0_8_ != &local_418) {
            operator_delete((void *)local_428._0_8_,
                            CONCAT26(local_418._6_2_,
                                     CONCAT15(local_418._M_local_buf[5],
                                              CONCAT14(local_418._M_local_buf[4],local_418._0_4_)))
                            + 1);
          }
          local_428._0_8_ = &local_418;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"units","");
          fileops::replaceIfMember(pbVar13,(string *)local_428,(string *)local_458);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._0_8_ != &local_418) {
            operator_delete((void *)local_428._0_8_,
                            CONCAT26(local_418._6_2_,
                                     CONCAT15(local_418._M_local_buf[5],
                                              CONCAT14(local_418._M_local_buf[4],local_418._0_4_)))
                            + 1);
          }
          local_428._0_8_ = &local_418;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"global","");
          local_328[0] = local_429;
          pbVar6 = toml::find_or<bool,toml::type_config,std::__cxx11::string>
                             (pbVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_428,(bool *)local_328);
          bVar3 = *pbVar6;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._0_8_ != &local_418) {
            operator_delete((void *)local_428._0_8_,
                            CONCAT26(local_418._6_2_,
                                     CONCAT15(local_418._M_local_buf[5],
                                              CONCAT14(local_418._M_local_buf[4],local_418._0_4_)))
                            + 1);
          }
          if (bVar3 == false) {
            local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_458._8_8_;
            pPStack_120 = (Publication *)local_458._0_8_;
            units_04._M_str = (char *)local_458._0_8_;
            units_04._M_len = local_458._8_8_;
            name_01._M_str = (char *)local_3f8._0_8_;
            name_01._M_len = local_3f8._8_8_;
            type_04._M_str = (char *)local_308._0_8_;
            type_04._M_len = local_308._8_8_;
            aVar10.inp = registerInput((ValueFederate *)local_408._M_pi,name_01,type_04,units_04);
          }
          else {
            local_428._0_8_ = local_458._8_8_;
            local_428._8_8_ = local_458._0_8_;
            units_03._M_str = (char *)local_458._0_8_;
            units_03._M_len = local_458._8_8_;
            key_04._M_str = (char *)local_3f8._0_8_;
            key_04._M_len = local_3f8._8_8_;
            type_03._M_str = (char *)local_308._0_8_;
            type_03._M_len = local_308._8_8_;
            aVar10.inp = ValueFederateManager::registerInput
                                   (*(ValueFederateManager **)&(local_408._M_pi)->_M_use_count,
                                    key_04,type_03,units_03);
          }
          if ((Publication *)local_458._0_8_ != (Publication *)local_448) {
            operator_delete((void *)local_458._0_8_,(ulong)(local_448._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8) {
            operator_delete((void *)local_308._0_8_,local_2f8._0_8_ + 1);
          }
        }
        local_458._0_8_ = (Publication *)local_448;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"default","");
        bVar3 = toml::basic_value<toml::type_config>::contains(pbVar13,(string *)local_458);
        if (bVar3) {
          pvVar4 = toml::basic_value<toml::type_config>::at(pbVar13,(string *)local_458);
          fileops::tomlAsString_abi_cxx11_((string *)local_308,(fileops *)pvVar4,element_07);
        }
        else {
          local_308._0_8_ = local_2f8;
          local_308._8_8_ = (Publication *)0x0;
          local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
        }
        if ((Publication *)local_458._0_8_ != (Publication *)local_448) {
          operator_delete((void *)local_458._0_8_,(ulong)(local_448._0_8_ + 1));
        }
        if ((Publication *)local_308._8_8_ != (Publication *)0x0) {
          std::
          variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
          ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       *)&(aVar10.inp)->lastValue,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308
                     );
        }
        loadOptions<toml::basic_value<toml::type_config>,helics::Input>
                  ((ValueFederate *)local_408._M_pi,pbVar13,aVar10.inp);
        local_458._0_8_ = (Publication *)local_448;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"source","");
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"publications","");
        addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__2>
                  (pbVar13,(string *)local_458,&local_1d8,aVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((Publication *)local_458._0_8_ != (Publication *)local_448) {
          operator_delete((void *)local_458._0_8_,(ulong)(local_448._0_8_ + 1));
        }
        local_458._0_8_ = (Publication *)local_448;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"source","");
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"targets","");
        key = (string *)local_458;
        addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__2>
                  (pbVar13,(string *)local_458,&local_1f8,aVar10);
        pvVar12 = extraout_RDX_11;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          key = (key_type *)(local_1f8.field_2._M_allocated_capacity + 1);
          operator_delete(local_1f8._M_dataplus._M_p,(ulong)key);
          pvVar12 = extraout_RDX_12;
        }
        if ((Publication *)local_458._0_8_ != (Publication *)local_448) {
          key = (key_type *)(local_448._0_8_ + 1);
          operator_delete((void *)local_458._0_8_,(ulong)key);
          pvVar12 = extraout_RDX_13;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8) {
          key = (key_type *)(local_2f8._0_8_ + 1);
          operator_delete((void *)local_308._0_8_,(ulong)key);
          pvVar12 = extraout_RDX_14;
        }
        if ((undefined1 *)local_3f8._0_8_ != local_3e8) {
          key = (key_type *)(local_3e8._0_8_ + 1);
          operator_delete((void *)local_3f8._0_8_,(ulong)key);
          pvVar12 = extraout_RDX_15;
        }
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 != (pointer)local_400._M_p);
    }
  }
  toml::basic_value<toml::type_config>::cleanup(&local_f8,(EVP_PKEY_CTX *)key);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f8.comments_);
  toml::detail::region::~region(&local_f8.region_);
  return;
}

Assistant:

void ValueFederate::registerValueInterfacesToml(const std::string& tomlString)
{
    using fileops::getOrDefault;
    using fileops::isMember;
    using fileops::replaceIfMember;

    toml::value doc;
    try {
        doc = fileops::loadToml(tomlString);
    }
    catch (const std::invalid_argument& ia) {
        throw(helics::InvalidParameter(ia.what()));
    }
    bool defaultGlobal = false;
    replaceIfMember(doc, "defaultglobal", defaultGlobal);

    if (isMember(doc, "publications")) {
        auto& pubs = toml::find(doc, "publications");
        if (!pubs.is_array()) {
            throw(helics::InvalidParameter("publications section in toml file must be an array"));
        }
        auto& pubArray = pubs.as_array();
        for (const auto& pub : pubArray) {
            auto name = fileops::getName(pub);

            Publication* pubObj = &vfManager->getPublication(name);
            if (!pubObj->isValid()) {
                auto type = getOrDefault(pub, "type", emptyStr);
                auto units = getOrDefault(pub, "unit", emptyStr);
                replaceIfMember(pub, "units", units);
                const bool global = getOrDefault(pub, "global", defaultGlobal);
                if (global) {
                    pubObj = &registerGlobalPublication(name, type, units);
                } else {
                    pubObj = &registerPublication(name, type, units);
                }
            }
            loadOptions(this, pub, *pubObj);
            auto addDestTarget = [pubObj](const std::string& target) {
                pubObj->addDestinationTarget(target);
            };
            addTargetVariations(pub, "destination", "inputs", addDestTarget);
            addTargetVariations(pub, "destination", "targets", addDestTarget);
        }
    }
    if (isMember(doc, "subscriptions")) {
        auto& subs = toml::find(doc, "subscriptions");
        if (!subs.is_array()) {
            // this line is tested in the publications section so not really necessary to check
            // again since it is an expensive test
            throw(helics::InvalidParameter(
                "subscriptions section in toml file must be an array"));  // LCOV_EXCL_LINE
        }
        auto& subArray = subs.as_array();
        for (const auto& sub : subArray) {
            auto name = fileops::getName(sub);
            bool skipNameTarget{false};
            if (name.empty()) {
                fileops::replaceIfMember(sub, "target", name);
                skipNameTarget = true;
            }
            Input* inp = &vfManager->getInputByTarget(name);
            if (!inp->isValid()) {
                auto type = getOrDefault(sub, "type", emptyStr);
                auto units = getOrDefault(sub, "unit", emptyStr);
                replaceIfMember(sub, "units", units);

                inp = &registerInput(emptyStr, type, units);
                if (!skipNameTarget) {
                    // this check is to prevent some warnings since targets get added later
                    inp->addTarget(name);
                }
            }
            auto defStr = fileops::getOrDefault(sub, "default", emptyStr);
            if (!defStr.empty()) {
                inp->setDefault(defStr);
            }
            loadOptions(this, sub, *inp);
            auto addDestTarget = [inp](const std::string& target) { inp->addSourceTarget(target); };
            addTargetVariations(sub, "source", "publications", addDestTarget);
            addTargetVariations(sub, "source", "targets", addDestTarget);
        }
    }
    if (isMember(doc, "inputs")) {
        auto& ipts = toml::find(doc, "inputs");
        if (!ipts.is_array()) {
            throw(helics::InvalidParameter(
                "inputs section in toml file must be an array"));  // LCOV_EXCL_LINE
        }
        auto& iptArray = ipts.as_array();
        for (const auto& ipt : iptArray) {
            auto name = fileops::getName(ipt);

            Input* inp = &vfManager->getInput(name);
            if (!inp->isValid()) {
                auto type = getOrDefault(ipt, "type", emptyStr);
                auto units = getOrDefault(ipt, "unit", emptyStr);
                replaceIfMember(ipt, "units", units);
                const bool global = getOrDefault(ipt, "global", defaultGlobal);
                if (global) {
                    inp = &registerGlobalInput(name, type, units);
                } else {
                    inp = &registerInput(name, type, units);
                }
            }
            auto defStr = fileops::getOrDefault(ipt, "default", emptyStr);
            if (!defStr.empty()) {
                inp->setDefault(defStr);
            }
            loadOptions(this, ipt, *inp);
            auto addDestTarget = [inp](const std::string& target) { inp->addSourceTarget(target); };
            addTargetVariations(ipt, "source", "publications", addDestTarget);
            addTargetVariations(ipt, "source", "targets", addDestTarget);
        }
    }
}